

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_free_buffer_list(png_structrp png_ptr,png_compression_bufferp *listp)

{
  png_compression_buffer *ppVar1;
  png_compression_bufferp next;
  png_compression_bufferp list;
  png_compression_bufferp *listp_local;
  png_structrp png_ptr_local;
  
  next = *listp;
  if (next != (png_compression_bufferp)0x0) {
    *listp = (png_compression_bufferp)0x0;
    do {
      ppVar1 = next->next;
      png_free(png_ptr,next);
      next = ppVar1;
    } while (ppVar1 != (png_compression_buffer *)0x0);
  }
  return;
}

Assistant:

void /* PRIVATE */
png_free_buffer_list(png_structrp png_ptr, png_compression_bufferp *listp)
{
   png_compression_bufferp list = *listp;

   if (list != NULL)
   {
      *listp = NULL;

      do
      {
         png_compression_bufferp next = list->next;

         png_free(png_ptr, list);
         list = next;
      }
      while (list != NULL);
   }
}